

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ClearMatches(cmMakefile *this)

{
  int iVar1;
  char *__nptr;
  string *psVar2;
  long lVar3;
  string *name;
  
  __nptr = GetDefinition(this,&nMatchesVariable_abi_cxx11_);
  if (__nptr != (char *)0x0) {
    iVar1 = atoi(__nptr);
    name = matchVariables_abi_cxx11_;
    for (lVar3 = 0; lVar3 <= iVar1; lVar3 = lVar3 + 1) {
      psVar2 = GetSafeDefinition(this,name);
      if (psVar2->_M_string_length != 0) {
        AddDefinition(this,name,"");
        cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
      }
      name = name + 1;
    }
    AddDefinition(this,&nMatchesVariable_abi_cxx11_,"0");
    cmStateSnapshot::GetDefinition(&this->StateSnapshot,&nMatchesVariable_abi_cxx11_);
    return;
  }
  return;
}

Assistant:

void cmMakefile::ClearMatches()
{
  const char* nMatchesStr = this->GetDefinition(nMatchesVariable);
  if (!nMatchesStr) {
    return;
  }
  int nMatches = atoi(nMatchesStr);
  for (int i = 0; i <= nMatches; i++) {
    std::string const& var = matchVariables[i];
    std::string const& s = this->GetSafeDefinition(var);
    if (!s.empty()) {
      this->AddDefinition(var, "");
      this->MarkVariableAsUsed(var);
    }
  }
  this->AddDefinition(nMatchesVariable, "0");
  this->MarkVariableAsUsed(nMatchesVariable);
}